

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

char * default_iconv_charset(char *charset)

{
  char *in_RDI;
  undefined8 local_8;
  
  if ((in_RDI == (char *)0x0) || (local_8 = in_RDI, *in_RDI == '\0')) {
    local_8 = nl_langinfo(0xe);
  }
  return local_8;
}

Assistant:

static const char *
default_iconv_charset(const char *charset) {
	if (charset != NULL && charset[0] != '\0')
		return charset;
#if HAVE_LOCALE_CHARSET && !defined(__APPLE__)
	/* locale_charset() is broken on Mac OS */
	return locale_charset();
#elif HAVE_NL_LANGINFO
	return nl_langinfo(CODESET);
#else
	return "";
#endif
}